

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddConcavePolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  ImVector<ImVec2> *this_00;
  float *pfVar6;
  float *pfVar7;
  void *scratch_buffer;
  uint in_ECX;
  int iVar8;
  int in_EDX;
  long in_RSI;
  ImVec2 *in_RDI;
  float fVar9;
  int i;
  int vtx_count_1;
  int idx_count_1;
  float inv_len2;
  float d2_1;
  float dm_y;
  float dm_x;
  ImVec2 *n1;
  ImVec2 *n0;
  int i1_1;
  int i0_1;
  float inv_len;
  float d2;
  float dy;
  float dx;
  ImVec2 *p1;
  ImVec2 *p0;
  int i1;
  int i0;
  ImVec2 *temp_normals;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  uint triangle [3];
  ImTriangulator triangulator;
  ImVec2 uv;
  void *in_stack_ffffffffffffff08;
  ImTriangulator *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int iVar10;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float local_c8;
  float local_c4;
  int local_b0;
  int local_ac;
  float local_a0;
  float local_9c;
  int local_88;
  int local_84;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  
  if ((2 < in_EDX) && ((in_ECX & 0xff000000) != 0)) {
    uVar3 = *(undefined8 *)in_RDI[7];
    ImTriangulator::ImTriangulator(in_stack_ffffffffffffff10);
    iVar8 = (int)((ulong)in_RDI >> 0x20);
    if (((uint)in_RDI[6].x & 4) == 0) {
      iVar5 = (in_EDX + -2) * 3;
      iVar10 = in_EDX;
      PrimReserve((ImDrawList *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),iVar8,
                  (int)in_RDI);
      for (iVar8 = 0; iVar8 < iVar10; iVar8 = iVar8 + 1) {
        *(undefined8 *)in_RDI[8] = *(undefined8 *)(in_RSI + (long)iVar8 * 8);
        *(undefined8 *)((long)in_RDI[8] + 8) = uVar3;
        *(uint *)((long)in_RDI[8] + 0x10) = in_ECX;
        in_RDI[8] = (ImVec2)((long)in_RDI[8] + 0x14);
      }
      scratch_buffer = (void *)((long)in_RDI[7] + 0x38);
      ImTriangulator::EstimateScratchBufferSize(in_EDX);
      ImVector<ImVec2>::reserve_discard
                ((ImVector<ImVec2> *)in_stack_ffffffffffffff10,(int)((ulong)scratch_buffer >> 0x20))
      ;
      ImTriangulator::Init
                ((ImTriangulator *)CONCAT44(iVar8,in_stack_ffffffffffffff20),in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),scratch_buffer);
      while (0 < local_50) {
        ImTriangulator::GetNextTriangle
                  ((ImTriangulator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (uint *)CONCAT44(iVar5,iVar10));
        *(int *)in_RDI[9] = (int)in_RDI[6].y + local_5c;
        *(int *)((long)in_RDI[9] + 4) = (int)in_RDI[6].y + local_58;
        *(int *)((long)in_RDI[9] + 8) = (int)in_RDI[6].y + local_54;
        in_RDI[9] = (ImVec2)((long)in_RDI[9] + 0xc);
      }
      in_RDI[6].y = (float)(iVar10 + (int)in_RDI[6].y);
    }
    else {
      fVar1 = in_RDI[0x17].x;
      PrimReserve((ImDrawList *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),iVar8,
                  (int)in_RDI);
      fVar2 = in_RDI[6].y;
      iVar8 = (int)in_RDI[6].y + 1;
      this_00 = (ImVector<ImVec2> *)((long)in_RDI[7] + 0x38);
      ImTriangulator::EstimateScratchBufferSize(in_EDX);
      ImVector<ImVec2>::reserve_discard(this_00,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      ImTriangulator::Init
                ((ImTriangulator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_RDI,(int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff08);
      while (0 < local_50) {
        ImTriangulator::GetNextTriangle
                  ((ImTriangulator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (uint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        *(int *)in_RDI[9] = (int)fVar2 + local_5c * 2;
        *(int *)((long)in_RDI[9] + 4) = (int)fVar2 + local_58 * 2;
        *(int *)((long)in_RDI[9] + 8) = (int)fVar2 + local_54 * 2;
        in_RDI[9] = (ImVec2)((long)in_RDI[9] + 0xc);
      }
      ImVector<ImVec2>::reserve_discard(this_00,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      lVar4 = *(long *)((long)in_RDI[7] + 0x40);
      local_84 = in_EDX + -1;
      for (local_88 = 0; local_88 < in_EDX; local_88 = local_88 + 1) {
        pfVar6 = (float *)(in_RSI + (long)local_84 * 8);
        pfVar7 = (float *)(in_RSI + (long)local_88 * 8);
        local_9c = *pfVar7 - *pfVar6;
        local_a0 = pfVar7[1] - pfVar6[1];
        fVar9 = local_9c * local_9c + local_a0 * local_a0;
        if (0.0 < fVar9) {
          fVar9 = ImRsqrt(fVar9);
          local_9c = fVar9 * local_9c;
          local_a0 = fVar9 * local_a0;
        }
        *(float *)(lVar4 + (long)local_84 * 8) = local_a0;
        *(float *)(lVar4 + 4 + (long)local_84 * 8) = -local_9c;
        local_84 = local_88;
      }
      local_ac = in_EDX + -1;
      for (local_b0 = 0; local_b0 < in_EDX; local_b0 = local_b0 + 1) {
        pfVar6 = (float *)(lVar4 + (long)local_ac * 8);
        pfVar7 = (float *)(lVar4 + (long)local_b0 * 8);
        local_c4 = (*pfVar6 + *pfVar7) * 0.5;
        local_c8 = (pfVar6[1] + pfVar7[1]) * 0.5;
        fVar9 = local_c4 * local_c4 + local_c8 * local_c8;
        if (1e-06 < fVar9) {
          fVar9 = 1.0 / fVar9;
          if (100.0 < fVar9) {
            fVar9 = 100.0;
          }
          local_c4 = fVar9 * local_c4;
          local_c8 = fVar9 * local_c8;
        }
        local_c4 = fVar1 * 0.5 * local_c4;
        local_c8 = fVar1 * 0.5 * local_c8;
        *(float *)in_RDI[8] = *(float *)(in_RSI + (long)local_b0 * 8) - local_c4;
        *(float *)((long)in_RDI[8] + 4) = *(float *)(in_RSI + 4 + (long)local_b0 * 8) - local_c8;
        *(undefined8 *)((long)in_RDI[8] + 8) = uVar3;
        *(uint *)((long)in_RDI[8] + 0x10) = in_ECX;
        *(float *)((long)in_RDI[8] + 0x14) = *(float *)(in_RSI + (long)local_b0 * 8) + local_c4;
        *(float *)((long)in_RDI[8] + 0x18) = *(float *)(in_RSI + 4 + (long)local_b0 * 8) + local_c8;
        *(undefined8 *)((long)in_RDI[8] + 0x1c) = uVar3;
        *(uint *)((long)in_RDI[8] + 0x24) = in_ECX & 0xffffff;
        in_RDI[8] = (ImVec2)((long)in_RDI[8] + 0x28);
        *(int *)in_RDI[9] = (int)fVar2 + local_b0 * 2;
        *(int *)((long)in_RDI[9] + 4) = (int)fVar2 + local_ac * 2;
        *(int *)((long)in_RDI[9] + 8) = iVar8 + local_ac * 2;
        *(int *)((long)in_RDI[9] + 0xc) = iVar8 + local_ac * 2;
        *(int *)((long)in_RDI[9] + 0x10) = iVar8 + local_b0 * 2;
        *(int *)((long)in_RDI[9] + 0x14) = (int)fVar2 + local_b0 * 2;
        in_RDI[9] = (ImVec2)((long)in_RDI[9] + 0x18);
        local_ac = local_b0;
      }
      in_RDI[6].y = (float)(in_EDX * 2 + (int)in_RDI[6].y);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConcavePolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3 || (col & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    ImTriangulator triangulator;
    unsigned int triangle[3];
    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2) * 3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;

        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (triangle[0] << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (triangle[1] << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (triangle[2] << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2) * 3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + triangle[0]); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + triangle[1]); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + triangle[2]);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}